

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.h
# Opt level: O0

Matrix<Rational> * __thiscall Matrix<Rational>::operator/=(Matrix<Rational> *this,Rational *a)

{
  Rational *this_00;
  Rational *in_RDI;
  longlong in_stack_ffffffffffffff38;
  Rational *in_stack_ffffffffffffff40;
  Matrix<Rational> *this_01;
  Rational *in_stack_ffffffffffffff60;
  Rational *in_stack_ffffffffffffff68;
  Matrix<Rational> local_90 [9];
  
  this_01 = local_90;
  Rational::Rational(in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
  ::operator/(in_stack_ffffffffffffff68,in_stack_ffffffffffffff60);
  this_00 = (Rational *)operator*=(this_01,in_RDI);
  Rational::~Rational(this_00);
  Rational::~Rational(this_00);
  return (Matrix<Rational> *)this_00;
}

Assistant:

inline Matrix &operator/=(Field a)
    {
        return operator*=(Field(1) / a);
    }